

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_mapper_posix.cpp
# Opt level: O0

shared_ptr<unsigned_char> __thiscall pstore::aligned_valloc(pstore *this,size_t size,uint align)

{
  anon_class_16_2_20c8ad4a_for__M_tp __d;
  void *__len;
  void *pvVar1;
  int *piVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<unsigned_char> sVar3;
  uint8_t *ptr_aligned;
  uintptr_t mask;
  anon_class_16_2_20c8ad4a_for__M_tp deleter;
  void *ptr;
  uint align_local;
  size_t size_local;
  
  __len = (void *)((align - 1) + size);
  pvVar1 = mmap((void *)0x0,(size_t)__len,3,0x22,-1,0);
  if (pvVar1 == (void *)0x0) {
    piVar2 = __errno_location();
    errno_erc::errno_erc((errno_erc *)((long)&deleter.size + 4),*piVar2);
    raise<pstore::errno_erc,char[5]>(deleter.size._4_4_,(char (*) [5])"mmap");
  }
  __d.size = (size_t)__len;
  __d.ptr = pvVar1;
  deleter.ptr = __len;
  std::shared_ptr<unsigned_char>::
  shared_ptr<unsigned_char,pstore::aligned_valloc(unsigned_long,unsigned_int)::__0,void>
            ((shared_ptr<unsigned_char> *)this,
             (uchar *)((long)pvVar1 + ((ulong)align - 1) & ((ulong)align - 1 ^ 0xffffffffffffffff)),
             __d);
  sVar3.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar3.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (shared_ptr<unsigned_char>)
         sVar3.super___shared_ptr<unsigned_char,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<std::uint8_t> aligned_valloc (std::size_t size, unsigned const align) {
        size += align - 1U;

        void * const ptr =
            ::mmap (nullptr, size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
        if (ptr == nullptr) {
            raise (pstore::errno_erc{errno}, "mmap");
        }

        auto const deleter = [ptr, size] (std::uint8_t * const) { ::munmap (ptr, size); };
        auto const mask = ~(std::uintptr_t{align} - 1);
        auto * const ptr_aligned = reinterpret_cast<std::uint8_t *> (
            (reinterpret_cast<std::uintptr_t> (ptr) + align - 1) & mask);
        return std::shared_ptr<std::uint8_t> (ptr_aligned, deleter);
    }